

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O3

int rewrite_branch(dmr_C *C,basic_block *bb,basic_block **ptr,basic_block *old,basic_block *new)

{
  int *piVar1;
  int iVar2;
  
  iVar2 = 0;
  if (((new != old) && (iVar2 = 0, *ptr == old)) && (bb->ep != (entrypoint *)0x0)) {
    piVar1 = &C->L->repeat_phase;
    *piVar1 = *piVar1 | 3;
    *ptr = new;
    iVar2 = 1;
    ptrlist_replace((ptr_list **)&bb->children,old,new,1);
    ptrlist_remove((ptr_list **)&old->parents,bb,1);
    ptrlist_add((ptr_list **)&new->parents,bb,&C->ptrlist_allocator);
  }
  return iVar2;
}

Assistant:

static int rewrite_branch(struct dmr_C *C, struct basic_block *bb,
	struct basic_block **ptr,
	struct basic_block *old,
	struct basic_block *new)
{
	if (*ptr != old || new == old || !bb->ep)
		return 0;

	/* We might find new if-conversions or non-dominating CSEs */
	/* we may also create new dead cycles */
	C->L->repeat_phase |= REPEAT_CSE | REPEAT_CFG_CLEANUP;
	*ptr = new;
	dmrC_replace_bb_in_list(&bb->children, old, new, 1);
	dmrC_remove_bb_from_list(&old->parents, bb, 1);
	dmrC_add_bb(C, &new->parents, bb);
	return 1;
}